

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

TypeIDHelper NULLC::Typeid(NULLCRef r)

{
  ExternTypeInfo *pEVar1;
  int *piVar2;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),in_stack_00000008
                     );
  if ((pEVar1->typeFlags & 4) == 0) {
    piVar2 = (int *)&stack0x00000008;
  }
  else {
    piVar2 = (int *)CONCAT44(r.typeID,in_stack_0000000c);
  }
  return (TypeIDHelper)*piVar2;
}

Assistant:

NULLC::TypeIDHelper NULLC::Typeid(NULLCRef r)
{
	TypeIDHelper help;

	if(linker->exTypes[r.typeID].typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE)
		help.id = *(int*)r.ptr;
	else
		help.id = r.typeID;

	return help;
}